

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> BupOutputter::makeComposited(void)

{
  _Head_base<0UL,_BupOutputter_*,_false> in_RDI;
  _Head_base<0UL,_BupOutputter_*,_false> __u;
  unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *in_stack_fffffffffffffff0;
  
  __u._M_head_impl = in_RDI._M_head_impl;
  std::make_unique<MTCompositedBupOutputter>();
  std::unique_ptr<BupOutputter,std::default_delete<BupOutputter>>::
  unique_ptr<MTCompositedBupOutputter,std::default_delete<MTCompositedBupOutputter>,void>
            (in_stack_fffffffffffffff0,
             (unique_ptr<MTCompositedBupOutputter,_std::default_delete<MTCompositedBupOutputter>_> *
             )__u._M_head_impl);
  std::unique_ptr<MTCompositedBupOutputter,_std::default_delete<MTCompositedBupOutputter>_>::
  ~unique_ptr((unique_ptr<MTCompositedBupOutputter,_std::default_delete<MTCompositedBupOutputter>_>
               *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<BupOutputter,_std::default_delete<BupOutputter>,_true,_true>)
         (tuple<BupOutputter_*,_std::default_delete<BupOutputter>_>)__u._M_head_impl;
}

Assistant:

std::unique_ptr<BupOutputter> BupOutputter::makeComposited() {
#if ENABLE_MULTITHREADED
	return std::make_unique<MTCompositedBupOutputter>();
#else
	return std::make_unique<CompositedBupOutputter>();
#endif
}